

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__hdr_info(stbi__context *s,int *x,int *y,int *comp)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  undefined4 *in_RCX;
  undefined4 *in_RDX;
  undefined4 *in_RSI;
  stbi__context *in_RDI;
  int dummy;
  int valid;
  char *token;
  char buffer [1024];
  undefined4 in_stack_fffffffffffffbc8;
  int iVar4;
  stbi__context *in_stack_fffffffffffffbd0;
  undefined4 *local_28;
  undefined4 *local_20;
  undefined4 *local_18;
  int local_4;
  
  iVar4 = 0;
  local_18 = in_RSI;
  if (in_RSI == (undefined4 *)0x0) {
    local_18 = (undefined4 *)&stack0xfffffffffffffbc8;
  }
  local_20 = in_RDX;
  if (in_RDX == (undefined4 *)0x0) {
    local_20 = (undefined4 *)&stack0xfffffffffffffbc8;
  }
  local_28 = in_RCX;
  if (in_RCX == (undefined4 *)0x0) {
    local_28 = (undefined4 *)&stack0xfffffffffffffbc8;
  }
  iVar1 = stbi__hdr_test(in_stack_fffffffffffffbd0);
  if (iVar1 == 0) {
    stbi__rewind(in_RDI);
    local_4 = 0;
  }
  else {
    while (in_stack_fffffffffffffbd0 =
                (stbi__context *)
                stbi__hdr_gettoken(in_stack_fffffffffffffbd0,
                                   (char *)CONCAT44(iVar4,in_stack_fffffffffffffbc8)),
          (char)in_stack_fffffffffffffbd0->img_x != '\0') {
      iVar1 = strcmp((char *)in_stack_fffffffffffffbd0,"FORMAT=32-bit_rle_rgbe");
      if (iVar1 == 0) {
        iVar4 = 1;
      }
    }
    if (iVar4 == 0) {
      stbi__rewind(in_RDI);
      local_4 = 0;
    }
    else {
      pcVar2 = stbi__hdr_gettoken(in_stack_fffffffffffffbd0,
                                  (char *)CONCAT44(iVar4,in_stack_fffffffffffffbc8));
      iVar4 = strncmp(pcVar2,"-Y ",3);
      if (iVar4 == 0) {
        pcVar2 = pcVar2 + 3;
        lVar3 = strtol(pcVar2,(char **)&stack0xfffffffffffffbd0,10);
        *local_20 = (int)lVar3;
        for (; *pcVar2 == ' '; pcVar2 = pcVar2 + 1) {
        }
        iVar4 = strncmp(pcVar2,"+X ",3);
        if (iVar4 == 0) {
          lVar3 = strtol(pcVar2 + 3,(char **)0x0,10);
          *local_18 = (int)lVar3;
          *local_28 = 3;
          local_4 = 1;
        }
        else {
          stbi__rewind(in_RDI);
          local_4 = 0;
        }
      }
      else {
        stbi__rewind(in_RDI);
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

static int stbi__hdr_info(stbi__context *s, int *x, int *y, int *comp)
{
   char buffer[STBI__HDR_BUFLEN];
   char *token;
   int valid = 0;
   int dummy;

   if (!x) x = &dummy;
   if (!y) y = &dummy;
   if (!comp) comp = &dummy;

   if (stbi__hdr_test(s) == 0) {
       stbi__rewind( s );
       return 0;
   }

   for(;;) {
      token = stbi__hdr_gettoken(s,buffer);
      if (token[0] == 0) break;
      if (strcmp(token, "FORMAT=32-bit_rle_rgbe") == 0) valid = 1;
   }

   if (!valid) {
       stbi__rewind( s );
       return 0;
   }
   token = stbi__hdr_gettoken(s,buffer);
   if (strncmp(token, "-Y ", 3)) {
       stbi__rewind( s );
       return 0;
   }
   token += 3;
   *y = (int) strtol(token, &token, 10);
   while (*token == ' ') ++token;
   if (strncmp(token, "+X ", 3)) {
       stbi__rewind( s );
       return 0;
   }
   token += 3;
   *x = (int) strtol(token, NULL, 10);
   *comp = 3;
   return 1;
}